

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhdp_writer.c
# Opt level: O0

void nhdp_writer_send_hello(nhdp_interface *ninterf)

{
  oonf_log_source oVar1;
  rfc5444_result rVar2;
  char *pcVar3;
  char *pcVar4;
  undefined1 local_c6 [8];
  netaddr_str buf;
  os_interface_listener *interf;
  rfc5444_result result;
  nhdp_interface *ninterf_local;
  
  if ((!_cleanedup) &&
     (buf.buf._54_8_ = &ninterf->os_if_listener,
     ((((ninterf->os_if_listener).data)->flags).loopback & 1U) == 0)) {
    if ((log_global_mask[LOG_NHDP_W] & 1) != 0) {
      oonf_log(LOG_SEVERITY_DEBUG,LOG_NHDP_W,"src/nhdp/nhdp/nhdp_writer.c",0xa4,(void *)0x0,0,
               "Sending Hello to interface %s",(ninterf->_node).key);
    }
    nhdp_domain_recalculate_mpr();
    _nhdp_if = ninterf;
    rVar2 = oonf_rfc5444_send_if(((ninterf->rfc5444_if).interface)->multicast4,'\0');
    oVar1 = LOG_NHDP_W;
    if ((rVar2 < RFC5444_OKAY) && ((log_global_mask[LOG_NHDP_W] & 4) != 0)) {
      pcVar3 = netaddr_to_prefixstring
                         ((netaddr_str *)local_c6,
                          &((ninterf->rfc5444_if).interface)->multicast4->dst,false);
      pcVar4 = rfc5444_strerror(rVar2);
      oonf_log(LOG_SEVERITY_WARN,oVar1,"src/nhdp/nhdp/nhdp_writer.c",0xaf,(void *)0x0,0,
               "Could not send NHDP message to %s: %s (%d)",pcVar3,pcVar4,rVar2);
    }
    rVar2 = oonf_rfc5444_send_if(((ninterf->rfc5444_if).interface)->multicast6,'\0');
    oVar1 = LOG_NHDP_W;
    if ((rVar2 < RFC5444_OKAY) && ((log_global_mask[LOG_NHDP_W] & 4) != 0)) {
      pcVar3 = netaddr_to_prefixstring
                         ((netaddr_str *)local_c6,
                          &((ninterf->rfc5444_if).interface)->multicast6->dst,false);
      pcVar4 = rfc5444_strerror(rVar2);
      oonf_log(LOG_SEVERITY_WARN,oVar1,"src/nhdp/nhdp/nhdp_writer.c",0xb6,(void *)0x0,0,
               "Could not send NHDP message to %s: %s (%d)",pcVar3,pcVar4,rVar2);
    }
  }
  return;
}

Assistant:

void
nhdp_writer_send_hello(struct nhdp_interface *ninterf) {
  enum rfc5444_result result;
  struct os_interface_listener *interf;
  struct netaddr_str buf;

  if (_cleanedup) {
    /* do not send more Hellos during shutdown */
    return;
  }

  interf = nhdp_interface_get_if_listener(ninterf);
  if (interf->data->flags.loopback) {
    /* no NHDP on loopback interface */
    return;
  }

  OONF_DEBUG(LOG_NHDP_W, "Sending Hello to interface %s", nhdp_interface_get_name(ninterf));

  nhdp_domain_recalculate_mpr();

  /* store NHDP interface */
  _nhdp_if = ninterf;

  /* send IPv4 (if socket is active) */
  result = oonf_rfc5444_send_if(ninterf->rfc5444_if.interface->multicast4, RFC6130_MSGTYPE_HELLO);
  if (result < 0) {
    OONF_WARN(LOG_NHDP_W, "Could not send NHDP message to %s: %s (%d)",
      netaddr_to_string(&buf, &ninterf->rfc5444_if.interface->multicast4->dst), rfc5444_strerror(result), result);
  }

  /* send IPV6 (if socket is active) */
  result = oonf_rfc5444_send_if(ninterf->rfc5444_if.interface->multicast6, RFC6130_MSGTYPE_HELLO);
  if (result < 0) {
    OONF_WARN(LOG_NHDP_W, "Could not send NHDP message to %s: %s (%d)",
      netaddr_to_string(&buf, &ninterf->rfc5444_if.interface->multicast6->dst), rfc5444_strerror(result), result);
  }
}